

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::InternalSwap(FileOptions *this,FileOptions *other)

{
  InternalMetadata *this_00;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  string *psVar20;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *pAVar21;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_002d20e0;
LAB_002d20cf:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002d20cf;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
LAB_002d20e0:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar19 = (ulong)arena & 1;
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->java_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->java_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->java_package_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->java_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->java_outer_classname_).ptr_ !=
       (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->java_outer_classname_).ptr_ !=
      (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->java_outer_classname_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->java_outer_classname_,
               (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->go_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->go_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->go_package_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->go_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->objc_class_prefix_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_
      ) || ((other->objc_class_prefix_).ptr_ !=
            (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->objc_class_prefix_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->objc_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_
               ,pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->csharp_namespace_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)
     || ((other->csharp_namespace_).ptr_ !=
         (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->csharp_namespace_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->csharp_namespace_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->swift_prefix_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->swift_prefix_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->swift_prefix_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->swift_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->php_class_prefix_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)
     || ((other->php_class_prefix_).ptr_ !=
         (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->php_class_prefix_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->php_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->php_namespace_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->php_namespace_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->php_namespace_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->php_namespace_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  pAVar21 = arena;
  if (uVar19 != 0) {
    pAVar21 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->php_metadata_namespace_).ptr_ !=
       (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->php_metadata_namespace_).ptr_ !=
      (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->php_metadata_namespace_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    internal::ArenaStringPtr::Mutable
              (&other->php_metadata_namespace_,
               (string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar21);
    std::__cxx11::string::swap((string *)psVar20);
    arena = (Arena *)this_00->ptr_;
    uVar19 = (ulong)((uint)arena & 1);
  }
  if (uVar19 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->ruby_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->ruby_package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar20 = internal::ArenaStringPtr::Mutable
                        (&this->ruby_package_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
    internal::ArenaStringPtr::Mutable
              (&other->ruby_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               arena);
    std::__cxx11::string::swap((string *)psVar20);
  }
  bVar11 = this->java_multiple_files_;
  bVar12 = this->java_generate_equals_and_hash_;
  bVar13 = this->java_string_check_utf8_;
  bVar14 = this->cc_generic_services_;
  bVar15 = this->java_generic_services_;
  bVar16 = this->py_generic_services_;
  bVar17 = this->php_generic_services_;
  bVar18 = this->deprecated_;
  bVar1 = other->java_generate_equals_and_hash_;
  bVar5 = other->java_string_check_utf8_;
  bVar6 = other->cc_generic_services_;
  bVar7 = other->java_generic_services_;
  bVar8 = other->py_generic_services_;
  bVar9 = other->php_generic_services_;
  bVar10 = other->deprecated_;
  this->java_multiple_files_ = other->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar1;
  this->java_string_check_utf8_ = bVar5;
  this->cc_generic_services_ = bVar6;
  this->java_generic_services_ = bVar7;
  this->py_generic_services_ = bVar8;
  this->php_generic_services_ = bVar9;
  this->deprecated_ = bVar10;
  other->java_multiple_files_ = bVar11;
  other->java_generate_equals_and_hash_ = bVar12;
  other->java_string_check_utf8_ = bVar13;
  other->cc_generic_services_ = bVar14;
  other->java_generic_services_ = bVar15;
  other->py_generic_services_ = bVar16;
  other->php_generic_services_ = bVar17;
  other->deprecated_ = bVar18;
  iVar3 = this->optimize_for_;
  this->optimize_for_ = other->optimize_for_;
  other->optimize_for_ = iVar3;
  bVar1 = this->cc_enable_arenas_;
  this->cc_enable_arenas_ = other->cc_enable_arenas_;
  other->cc_enable_arenas_ = bVar1;
  return;
}

Assistant:

void FileOptions::InternalSwap(FileOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  java_package_.Swap(&other->java_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  java_outer_classname_.Swap(&other->java_outer_classname_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  go_package_.Swap(&other->go_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  objc_class_prefix_.Swap(&other->objc_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  csharp_namespace_.Swap(&other->csharp_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swift_prefix_.Swap(&other->swift_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_class_prefix_.Swap(&other->php_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_namespace_.Swap(&other->php_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_metadata_namespace_.Swap(&other->php_metadata_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ruby_package_.Swap(&other->ruby_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileOptions, deprecated_)
      + sizeof(FileOptions::deprecated_)
      - PROTOBUF_FIELD_OFFSET(FileOptions, java_multiple_files_)>(
          reinterpret_cast<char*>(&java_multiple_files_),
          reinterpret_cast<char*>(&other->java_multiple_files_));
  swap(optimize_for_, other->optimize_for_);
  swap(cc_enable_arenas_, other->cc_enable_arenas_);
}